

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adapter.cpp
# Opt level: O1

void msocket_adapter_udp_msg(void *arg,char *addr,uint16_t port,uint8_t *dataBuf,uint32_t dataLen)

{
  string address;
  allocator<char> local_49;
  long *local_48 [2];
  long local_38 [2];
  
  if (arg != (void *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,addr,&local_49);
    (**(code **)(*arg + 8))(arg,(string *)local_48,port,dataBuf,dataLen);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return;
}

Assistant:

static void msocket_adapter_udp_msg(void* arg, const char* addr, uint16_t port, const uint8_t* dataBuf, uint32_t dataLen)
{
   auto handler = reinterpret_cast<msocket::Handler*>(arg);
   if (handler != nullptr)
   {
      std::string address{ addr };
      std::size_t size = static_cast<std::size_t>(dataLen);
      handler->udp_message_received(address, port, dataBuf, size);
   }
}